

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcColourRgb::~IfcColourRgb(IfcColourRgb *this)

{
  ~IfcColourRgb(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

IfcColourRgb() : Object("IfcColourRgb") {}